

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom_test.cc
# Opt level: O2

Event * anon_unknown.dwarf_5400::Event::Open(Event *__return_storage_ptr__,string *filename)

{
  __return_storage_ptr__->type = kOpen;
  __return_storage_ptr__->length = 0;
  __return_storage_ptr__->flags = 0;
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  (__return_storage_ptr__->filename)._M_string_length = 0;
  (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->filename);
  return __return_storage_ptr__;
}

Assistant:

static Event Open(const std::string &filename) {
    Event e(Syscall::kOpen);
    e.filename = filename;
    return e;
  }